

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void handleSelectionRequest(XEvent *event)

{
  undefined4 local_d8 [2];
  XEvent response;
  XSelectionRequestEvent *request;
  XEvent *event_local;
  
  response.pad[0x17] = (long)event;
  request = (XSelectionRequestEvent *)event;
  memset(local_d8,0,0xc0);
  response.xselectionrequest.selection =
       writeTargetToProperty((XSelectionRequestEvent *)response.pad[0x17]);
  local_d8[0] = 0x1f;
  response.xerror.resourceid = *(XID *)(response.pad[0x17] + 0x18);
  response.xany.display = (Display *)*(undefined8 *)(response.pad[0x17] + 0x28);
  response.xany.window = *(Window *)(response.pad[0x17] + 0x30);
  response.xkey.root = *(Window *)(response.pad[0x17] + 0x38);
  response.xkey.time = *(Time *)(response.pad[0x17] + 0x48);
  XSendEvent(_glfw.x11.display,*(undefined8 *)(response.pad[0x17] + 0x28),0,0,local_d8);
  return;
}

Assistant:

static void handleSelectionRequest(XEvent* event)
{
    const XSelectionRequestEvent* request = &event->xselectionrequest;

    XEvent response;
    memset(&response, 0, sizeof(response));

    response.xselection.property = writeTargetToProperty(request);
    response.xselection.type = SelectionNotify;
    response.xselection.display = request->display;
    response.xselection.requestor = request->requestor;
    response.xselection.selection = request->selection;
    response.xselection.target = request->target;
    response.xselection.time = request->time;

    XSendEvent(_glfw.x11.display, request->requestor, False, 0, &response);
}